

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_encode.cpp
# Opt level: O0

string_t duckdb::URLDecodeOperator::Operation<duckdb::string_t,duckdb::string_t>
                   (string_t input,Vector *result)

{
  string_t *this;
  idx_t iVar1;
  ulong uVar2;
  char *pcVar3;
  Vector *in_RDX;
  idx_t result_length;
  idx_t input_size;
  char *input_str;
  string_t result_str;
  string_t *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar4;
  string_t local_20;
  anon_union_16_2_67f50693_for_value local_10;
  
  this = (string_t *)string_t::GetData(in_stack_ffffffffffffffa0);
  iVar1 = string_t::GetSize(&local_20);
  uVar4 = 0;
  uVar2 = duckdb::StringUtil::URLDecodeSize((char *)this,iVar1,false);
  local_10 = (anon_union_16_2_67f50693_for_value)duckdb::StringVector::EmptyString(in_RDX,uVar2);
  pcVar3 = string_t::GetDataWriteable(this);
  duckdb::StringUtil::URLDecodeBuffer((char *)this,iVar1,pcVar3,SUB41(uVar4,0));
  string_t::Finalize((string_t *)CONCAT44(uVar4,in_stack_ffffffffffffffb0));
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_10.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_str = input.GetData();
		auto input_size = input.GetSize();
		idx_t result_length = StringUtil::URLDecodeSize(input_str, input_size);
		auto result_str = StringVector::EmptyString(result, result_length);
		StringUtil::URLDecodeBuffer(input_str, input_size, result_str.GetDataWriteable());
		result_str.Finalize();
		return result_str;
	}